

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inproc_lat.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  void *__s;
  uint64_t uVar2;
  undefined1 auVar3 [16];
  double latency;
  uint64_t elapsed;
  nn_stopwatch stopwatch;
  nn_thread thread;
  char *buf;
  int i;
  int w;
  int s;
  int rc;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  _s = argv;
  argv_local._0_4_ = argc;
  if (argc == 3) {
    iVar1 = atoi(argv[1]);
    message_size = (size_t)iVar1;
    roundtrip_count = atoi(_s[2]);
    i = nn_socket(1,0x10);
    if (i == -1) {
      __assert_fail("s != -1",
                    "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/perf/inproc_lat.c"
                    ,0x55,"int main(int, char **)");
    }
    w = nn_bind(i,"inproc://inproc_lat");
    if (w < 0) {
      __assert_fail("rc >= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/perf/inproc_lat.c"
                    ,0x57,"int main(int, char **)");
    }
    buf._4_4_ = nn_socket(1,0x10);
    if (buf._4_4_ == -1) {
      __assert_fail("w != -1",
                    "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/perf/inproc_lat.c"
                    ,0x5a,"int main(int, char **)");
    }
    w = nn_connect(buf._4_4_,"inproc://inproc_lat");
    if (w < 0) {
      __assert_fail("rc >= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/perf/inproc_lat.c"
                    ,0x5c,"int main(int, char **)");
    }
    __s = malloc(message_size);
    if (__s == (void *)0x0) {
      __assert_fail("buf",
                    "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/perf/inproc_lat.c"
                    ,0x5f,"int main(int, char **)");
    }
    memset(__s,0x6f,message_size);
    nn_thread_init((nn_thread *)&stopwatch,worker,(void *)((long)&buf + 4));
    nn_sleep(100);
    nn_stopwatch_init((nn_stopwatch *)&elapsed);
    for (buf._0_4_ = 0; (int)buf != roundtrip_count; buf._0_4_ = (int)buf + 1) {
      w = nn_send(i,__s,message_size,0);
      if (w != (int)message_size) {
        __assert_fail("rc == (int)message_size",
                      "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/perf/inproc_lat.c"
                      ,0x6a,"int main(int, char **)");
      }
      w = nn_recv(i,__s,message_size,0);
      if (w != (int)message_size) {
        __assert_fail("rc == (int)message_size",
                      "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/perf/inproc_lat.c"
                      ,0x6c,"int main(int, char **)");
      }
    }
    uVar2 = nn_stopwatch_term((nn_stopwatch *)&elapsed);
    auVar3._8_4_ = (int)(uVar2 >> 0x20);
    auVar3._0_8_ = uVar2;
    auVar3._12_4_ = 0x45300000;
    iVar1 = roundtrip_count << 1;
    printf("message size: %d [B]\n",message_size & 0xffffffff);
    printf("roundtrip count: %d\n",(ulong)(uint)roundtrip_count);
    printf("average latency: %.3f [us]\n",
           ((auVar3._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)) / (double)iVar1);
    nn_thread_term((nn_thread *)&stopwatch);
    free(__s);
    w = nn_close(i);
    if (w != 0) {
      __assert_fail("rc == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/perf/inproc_lat.c"
                    ,0x79,"int main(int, char **)");
    }
    w = nn_close(buf._4_4_);
    if (w != 0) {
      __assert_fail("rc == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/perf/inproc_lat.c"
                    ,0x7b,"int main(int, char **)");
    }
    argv_local._4_4_ = 0;
  }
  else {
    printf("usage: inproc_lat <message-size> <roundtrip-count>\n");
    argv_local._4_4_ = 1;
  }
  return argv_local._4_4_;
}

Assistant:

int main (int argc, char *argv [])
{
    int rc;
    int s;
    int w;
    int i;
    char *buf;
    struct nn_thread thread;
    struct nn_stopwatch stopwatch;
    uint64_t elapsed;
    double latency;

    if (argc != 3) {
        printf ("usage: inproc_lat <message-size> <roundtrip-count>\n");
        return 1;
    }

    message_size = atoi (argv [1]);
    roundtrip_count = atoi (argv [2]);

    s = nn_socket (AF_SP, NN_PAIR);
    assert (s != -1);
    rc = nn_bind (s, "inproc://inproc_lat");
    assert (rc >= 0);

    w = nn_socket (AF_SP, NN_PAIR);
    assert (w != -1);
    rc = nn_connect (w, "inproc://inproc_lat");
    assert (rc >= 0);

    buf = malloc (message_size);
    assert (buf);
    memset (buf, 111, message_size);

    /*  Wait a bit till the worker thread blocks in nn_recv(). */
    nn_thread_init (&thread, worker, &w);
    nn_sleep (100);

    nn_stopwatch_init (&stopwatch);

    for (i = 0; i != roundtrip_count; i++) {
        rc = nn_send (s, buf, message_size, 0);
        assert (rc == (int)message_size);
        rc = nn_recv (s, buf, message_size, 0);
        assert (rc == (int)message_size);
    }

    elapsed = nn_stopwatch_term (&stopwatch);

    latency = (double) elapsed / (roundtrip_count * 2);
    printf ("message size: %d [B]\n", (int) message_size);
    printf ("roundtrip count: %d\n", (int) roundtrip_count);
    printf ("average latency: %.3f [us]\n", (double) latency);

    nn_thread_term (&thread);
    free (buf);
    rc = nn_close (s);
    assert (rc == 0);
    rc = nn_close (w);
    assert (rc == 0);

    return 0;
}